

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aq_cyclicrefresh.h
# Opt level: O0

int cyclic_refresh_segment_id(int segment_id)

{
  int segment_id_local;
  undefined4 local_4;
  
  if (segment_id == 1) {
    local_4 = 1;
  }
  else if (segment_id == 2) {
    local_4 = 2;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static inline int cyclic_refresh_segment_id(int segment_id) {
  if (segment_id == CR_SEGMENT_ID_BOOST1)
    return CR_SEGMENT_ID_BOOST1;
  else if (segment_id == CR_SEGMENT_ID_BOOST2)
    return CR_SEGMENT_ID_BOOST2;
  else
    return CR_SEGMENT_ID_BASE;
}